

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwm.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  SDL_Surface *pSVar3;
  code *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  char **ppcVar7;
  Uint32 UVar8;
  int local_88;
  int local_84;
  Uint8 *icon_mask;
  SDL_Event event;
  undefined8 local_60;
  undefined8 local_58;
  uint local_50;
  uint local_48;
  undefined8 local_40;
  char *title;
  
  iVar2 = SDL_Init(0x20);
  if (iVar2 < 0) {
    main_cold_1();
    iVar2 = 1;
  }
  else {
    video_bpp = '\b';
    video_flags = 0;
    UVar8 = 0;
    local_84 = 0x280;
    local_88 = 0x1e0;
    do {
      if (argc < 2) {
LAB_00101c37:
        bVar1 = true;
        ppcVar7 = argv;
        if (2 < argc) {
          pcVar6 = argv[1];
          iVar2 = strcmp(pcVar6,"-width");
          if (iVar2 == 0) {
            local_84 = atoi(argv[2]);
          }
          else {
            iVar2 = strcmp(pcVar6,"-height");
            if (iVar2 == 0) {
              local_88 = atoi(argv[2]);
            }
            else {
              iVar2 = strcmp(pcVar6,"-bpp");
              if (iVar2 != 0) goto LAB_00101ce7;
              iVar2 = atoi(argv[2]);
              video_bpp = (Uint8)iVar2;
            }
          }
          ppcVar7 = argv + 2;
          argc = argc + -2;
          bVar1 = false;
        }
      }
      else {
        ppcVar7 = argv + 1;
        pcVar6 = argv[1];
        iVar2 = strcmp(pcVar6,"-fullscreen");
        if (iVar2 == 0) {
          UVar8 = UVar8 | 0x80000000;
        }
        else {
          iVar2 = strcmp(pcVar6,"-resize");
          if (iVar2 == 0) {
            UVar8 = UVar8 | 0x10;
          }
          else {
            iVar2 = strcmp(pcVar6,"-noframe");
            if (iVar2 != 0) goto LAB_00101c37;
            UVar8 = UVar8 | 0x20;
          }
        }
        argc = argc + -1;
        bVar1 = false;
        video_flags = UVar8;
      }
LAB_00101ce7:
      argv = ppcVar7;
    } while (!bVar1);
    pSVar3 = LoadIconSurface("icon.bmp",&icon_mask);
    if (pSVar3 != (SDL_Surface *)0x0) {
      SDL_WM_SetIcon(pSVar3,icon_mask);
    }
    if (icon_mask != (Uint8 *)0x0) {
      free(icon_mask);
    }
    title = testtitle;
    if (ppcVar7[1] != (char *)0x0) {
      title = ppcVar7[1];
    }
    SDL_WM_SetCaption(title,"testwm");
    SDL_WM_GetCaption(&title,0);
    if (title == (char *)0x0) {
      puts("No window title was set!");
    }
    else {
      printf("Title was set to: %s\n");
    }
    iVar2 = SetVideoMode(local_84,local_88);
    if (iVar2 < 0) {
      SDL_Quit();
      exit(1);
    }
    event._0_2_ = 0x201;
    event.active.state = 'E';
    iVar2 = SDL_GetWMInfo();
    if (iVar2 == 1) {
      printf("X11 syswm info: display=%p window=%X lock_func=%p unlock_func=%p fswindow=%X wmwindow=%X gfxdisplay=%p\n"
             ,CONCAT44(event.key.keysym.mod,event.key.keysym.sym),(ulong)(uint)event._16_4_,local_60
             ,local_58,(ulong)local_50,(ulong)local_48,local_40);
    }
    else {
      uVar5 = SDL_GetError();
      printf("Failed to get syswm info: %s\n",uVar5);
    }
    pcVar4 = (code *)SDL_GL_GetProcAddress("SDL12COMPAT_GetWindow");
    pcVar6 = "";
    if (pcVar4 == (code *)0x0) {
      pcVar6 = " (probably using classic SDL 1.2)";
    }
    printf("SDL12COMPAT_GetWindow address is %p%s\n",pcVar4,pcVar6);
    if (pcVar4 != (code *)0x0) {
      uVar5 = (*pcVar4)();
      printf("SDL 2.0 window: %p\n",uVar5);
    }
    SDL_EventState(0xd,1);
    SDL_SetEventFilter(FilterEvents);
    iVar2 = SDL_WaitEvent(&event);
    if (iVar2 != 0) {
      do {
        if (event.type == '\x10') {
          printf("Got a resize event: %dx%d\n",(ulong)(uint)event.resize.w,
                 (ulong)event.key.keysym.sym);
          SetVideoMode(event.resize.w,event.resize.h);
        }
        else {
          if (event.type == '\f') {
LAB_00101f0f:
            puts("Bye bye..");
            SDL_Quit();
            exit(0);
          }
          if (event.type == '\x18') {
            puts("Handling internal quit request");
            goto LAB_00101f0f;
          }
          printf("Warning: Event %d wasn\'t filtered\n");
        }
        iVar2 = SDL_WaitEvent(&event);
      } while (iVar2 != 0);
    }
    uVar5 = SDL_GetError();
    printf("SDL_WaitEvent() error: %s\n",uVar5);
    SDL_Quit();
    iVar2 = 0xff;
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Event event;
	char *title;
	SDL_Surface *icon;
	Uint8 *icon_mask;
	int parsed;
	int w, h;

	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr,
			"Couldn't initialize SDL: %s\n", SDL_GetError());
		return(1);
	}

	/* Check command line arguments */
	w = 640;
	h = 480;
	video_bpp = 8;
	video_flags = SDL_SWSURFACE;
	parsed = 1;
	while ( parsed ) {
		if ( (argc >= 2) && (strcmp(argv[1], "-fullscreen") == 0) ) {
			video_flags |= SDL_FULLSCREEN;
			argc -= 1;
			argv += 1;
		} else
		if ( (argc >= 2) && (strcmp(argv[1], "-resize") == 0) ) {
			video_flags |= SDL_RESIZABLE;
			argc -= 1;
			argv += 1;
		} else
		if ( (argc >= 2) && (strcmp(argv[1], "-noframe") == 0) ) {
			video_flags |= SDL_NOFRAME;
			argc -= 1;
			argv += 1;
		} else
		if ( (argc >= 3) && (strcmp(argv[1], "-width") == 0) ) {
			w = atoi(argv[2]);
			argc -= 2;
			argv += 2;
		} else
		if ( (argc >= 3) && (strcmp(argv[1], "-height") == 0) ) {
			h = atoi(argv[2]);
			argc -= 2;
			argv += 2;
		} else
		if ( (argc >= 3) && (strcmp(argv[1], "-bpp") == 0) ) {
			video_bpp = atoi(argv[2]);
			argc -= 2;
			argv += 2;
		} else {
			parsed = 0;
		}
	}

	/* Set the icon -- this must be done before the first mode set */
	icon = LoadIconSurface("icon.bmp", &icon_mask);
	if ( icon != NULL ) {
		SDL_WM_SetIcon(icon, icon_mask);
	}
	if ( icon_mask != NULL )
		free(icon_mask);

	/* Set the title bar */
	if ( argv[1] == NULL )
		title = testtitle;
	else
		title = argv[1];
	SDL_WM_SetCaption(title, "testwm");

	/* See if it's really set */
	SDL_WM_GetCaption(&title, NULL);
	if ( title )
		printf("Title was set to: %s\n", title);
	else
		printf("No window title was set!\n");

	/* Initialize the display */
	if ( SetVideoMode(w, h) < 0 ) {
		quit(1);
	}

#ifdef TEST_SYSWM
	{
		SDL_SysWMinfo syswm_info;
		SDL_VERSION(&syswm_info.version);
		if (SDL_GetWMInfo(&syswm_info) != 1) {
			printf("Failed to get syswm info: %s\n", SDL_GetError());
		} else {
			#ifdef _WIN32
			printf("Windows syswm info: hwnd=%X hglrc=%X\n",
			        (unsigned int) (size_t) syswm_info.window,
			        (unsigned int) (size_t) syswm_info.hglrc);
			#elif defined(SDL_VIDEO_DRIVER_X11)
			printf("X11 syswm info: display=%p window=%X lock_func=%p unlock_func=%p fswindow=%X wmwindow=%X gfxdisplay=%p\n",
			        syswm_info.info.x11.display,
			        (unsigned int) (size_t) syswm_info.info.x11.window,
			        syswm_info.info.x11.lock_func,
			        syswm_info.info.x11.unlock_func,
			        (unsigned int) (size_t) syswm_info.info.x11.fswindow,
			        (unsigned int) (size_t) syswm_info.info.x11.wmwindow,
			        syswm_info.info.x11.gfxdisplay);
			#else
			printf("Generic syswm info: data=%X\n", syswm_info.data);
			#endif
		}
	}

	{
		typedef SDL_Window* (SDLCALL *fnSDL12COMPAT_GetWindow)(void);
		fnSDL12COMPAT_GetWindow pfnSDL12COMPAT_GetWindow = (fnSDL12COMPAT_GetWindow) SDL_GL_GetProcAddress("SDL12COMPAT_GetWindow");
		printf("SDL12COMPAT_GetWindow address is %p%s\n", pfnSDL12COMPAT_GetWindow, pfnSDL12COMPAT_GetWindow ? "" : " (probably using classic SDL 1.2)");
		if (pfnSDL12COMPAT_GetWindow != NULL) {
			printf("SDL 2.0 window: %p\n", pfnSDL12COMPAT_GetWindow());
		}
	}

	SDL_EventState(SDL_SYSWMEVENT, SDL_ENABLE);
#endif

	/* Set an event filter that discards everything but QUIT */
	SDL_SetEventFilter(FilterEvents);

	/* Loop, waiting for QUIT */
	while ( SDL_WaitEvent(&event) ) {
		switch (event.type) {
			case SDL_VIDEORESIZE:
				printf("Got a resize event: %dx%d\n",
				       event.resize.w, event.resize.h);
				SetVideoMode(event.resize.w, event.resize.h);
				break;
			case SDL_USEREVENT:
				printf("Handling internal quit request\n");
				/* Fall through to the quit handler */
			case SDL_QUIT:
				printf("Bye bye..\n");
				quit(0);
			default:
				/* This should never happen */
				printf("Warning: Event %d wasn't filtered\n",
								event.type);
				break;
		}
	}
	printf("SDL_WaitEvent() error: %s\n", SDL_GetError());
	SDL_Quit();
	return(255);
}